

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Base.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Base::BP5BitfieldSet(BP5Base *this,BP5MetadataInfoStruct *MBase,int Bit)

{
  ulong uVar1;
  void *pvVar2;
  int in_EDX;
  ulong *in_RSI;
  int ElementBit;
  size_t Element;
  
  uVar1 = (ulong)(long)in_EDX >> 6;
  if (*in_RSI <= uVar1) {
    pvVar2 = realloc((void *)in_RSI[1],(uVar1 + 1) * 8);
    in_RSI[1] = (ulong)pvVar2;
    memset((void *)(in_RSI[1] + *in_RSI * 8),0,((uVar1 - *in_RSI) + 1) * 8);
    *in_RSI = uVar1 + 1;
  }
  *(ulong *)(in_RSI[1] + uVar1 * 8) =
       1L << ((byte)in_EDX & 0x3f) | *(ulong *)(in_RSI[1] + uVar1 * 8);
  return;
}

Assistant:

void BP5Base::BP5BitfieldSet(struct BP5MetadataInfoStruct *MBase, int Bit) const
{
    size_t Element = Bit / (sizeof(size_t) * 8);
    int ElementBit = Bit % (sizeof(size_t) * 8);
    if (static_cast<size_t>(Element) >= MBase->BitFieldCount)
    {
        MBase->BitField = (size_t *)realloc(MBase->BitField, sizeof(size_t) * (Element + 1));
        memset(MBase->BitField + MBase->BitFieldCount, 0,
               (Element - MBase->BitFieldCount + 1) * sizeof(size_t));
        MBase->BitFieldCount = Element + 1;
    }
    MBase->BitField[Element] |= ((size_t)1 << ElementBit);
}